

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  Reader *pRVar1;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  uint64_t uVar5;
  Fault local_458;
  Fault f_3;
  uint64_t local_420;
  Reader local_418;
  uint64_t local_3e8;
  DebugExpression<unsigned_long> local_3e0;
  undefined1 local_3d8 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  Fault f_2;
  uint64_t local_378;
  Reader local_370;
  uint64_t local_340;
  DebugExpression<unsigned_long> local_338;
  undefined1 local_330 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_1;
  Fault f_1;
  uint64_t local_2d0;
  Reader local_2c8;
  uint64_t local_298;
  DebugExpression<unsigned_long> local_290;
  undefined1 local_288 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  Reader local_230;
  Reader local_200;
  Reader local_1d0;
  Fault local_1a0;
  Fault f;
  Maybe<capnp::schema::Field::Reader> local_190;
  Maybe<capnp::schema::Node::Reader> local_150;
  Reader local_118;
  Maybe<capnp::schema::Field::Reader> local_d0;
  Maybe<capnp::schema::Node::Reader> local_90;
  Reader local_58;
  UpgradeToStructMode local_24;
  Reader *pRStack_20;
  UpgradeToStructMode upgradeToStructMode_local;
  Reader *replacement_local;
  Reader *type_local;
  CompatibilityChecker *this_local;
  
  local_24 = upgradeToStructMode;
  pRStack_20 = replacement;
  replacement_local = type;
  type_local = (Reader *)this;
  WVar3 = capnp::schema::Type::Reader::which(replacement);
  WVar4 = capnp::schema::Type::Reader::which(replacement_local);
  if (WVar3 == WVar4) {
    WVar3 = capnp::schema::Type::Reader::which(replacement_local);
    switch(WVar3) {
    case VOID:
    case BOOL:
    case INT8:
    case INT16:
    case INT32:
    case INT64:
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
    case FLOAT32:
    case FLOAT64:
    case TEXT:
    case DATA:
    case ANY_POINTER:
      break;
    case LIST:
      capnp::schema::Type::Reader::getList(&local_200,replacement_local);
      capnp::schema::Type::List::Reader::getElementType(&local_1d0,&local_200);
      capnp::schema::Type::Reader::getList((Reader *)&_kjCondition.result,pRStack_20);
      capnp::schema::Type::List::Reader::getElementType(&local_230,(Reader *)&_kjCondition.result);
      checkCompatibility(this,&local_1d0,&local_230,ALLOW_UPGRADE_TO_STRUCT);
      break;
    case ENUM:
      capnp::schema::Type::Reader::getEnum(&local_2c8,pRStack_20);
      local_298 = capnp::schema::Type::Enum::Reader::getTypeId(&local_2c8);
      local_290 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_298);
      capnp::schema::Type::Reader::getEnum((Reader *)&f_1,replacement_local);
      local_2d0 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)&f_1);
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_288,&local_290,&local_2d0);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_288);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[23]>
                  ((Fault *)&_kjCondition_1.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,1000,FAILED,"replacement.getEnum().getTypeId() == type.getEnum().getTypeId()",
                   "_kjCondition,\"type changed enum type\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_288,
                   (char (*) [23])"type changed enum type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_1.result);
      }
      break;
    case STRUCT:
      capnp::schema::Type::Reader::getStruct(&local_370,pRStack_20);
      local_340 = capnp::schema::Type::Struct::Reader::getTypeId(&local_370);
      local_338 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_340);
      capnp::schema::Type::Reader::getStruct((Reader *)&f_2,replacement_local);
      local_378 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)&f_2);
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_330,&local_338,&local_378);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
                  ((Fault *)&_kjCondition_2.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x3f4,FAILED,
                   "replacement.getStruct().getTypeId() == type.getStruct().getTypeId()",
                   "_kjCondition,\"type changed to incompatible struct type\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_330,
                   (char (*) [41])"type changed to incompatible struct type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2.result);
      }
      break;
    case INTERFACE:
      capnp::schema::Type::Reader::getInterface(&local_418,pRStack_20);
      local_3e8 = capnp::schema::Type::Interface::Reader::getTypeId(&local_418);
      local_3e0 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3e8);
      capnp::schema::Type::Reader::getInterface((Reader *)&f_3,replacement_local);
      local_420 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)&f_3);
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_3d8,&local_3e0,&local_420);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d8);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[44]>
                  (&local_458,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x3f9,FAILED,
                   "replacement.getInterface().getTypeId() == type.getInterface().getTypeId()",
                   "_kjCondition,\"type changed to incompatible interface type\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_3d8,
                   (char (*) [44])"type changed to incompatible interface type");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_458);
      }
    }
  }
  else {
    bVar2 = capnp::schema::Type::Reader::isData(pRStack_20);
    if ((bVar2) && (bVar2 = canUpgradeToData(this,replacement_local), bVar2)) {
      replacementIsNewer(this);
    }
    else {
      bVar2 = capnp::schema::Type::Reader::isData(replacement_local);
      if ((bVar2) && (bVar2 = canUpgradeToData(this,pRStack_20), bVar2)) {
        replacementIsOlder(this);
      }
      else {
        bVar2 = capnp::schema::Type::Reader::isAnyPointer(pRStack_20);
        if ((bVar2) && (bVar2 = canUpgradeToAnyPointer(this,replacement_local), bVar2)) {
          replacementIsNewer(this);
        }
        else {
          bVar2 = capnp::schema::Type::Reader::isAnyPointer(replacement_local);
          if ((bVar2) && (bVar2 = canUpgradeToAnyPointer(this,pRStack_20), bVar2)) {
            replacementIsOlder(this);
          }
          else {
            if (local_24 == ALLOW_UPGRADE_TO_STRUCT) {
              bVar2 = capnp::schema::Type::Reader::isStruct(replacement_local);
              pRVar1 = pRStack_20;
              if (bVar2) {
                capnp::schema::Type::Reader::getStruct(&local_58,replacement_local);
                uVar5 = capnp::schema::Type::Struct::Reader::getTypeId(&local_58);
                kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_90);
                kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_d0);
                checkUpgradeToStruct(this,pRVar1,uVar5,&local_90,&local_d0);
                kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_d0);
                kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_90);
                return;
              }
              bVar2 = capnp::schema::Type::Reader::isStruct(pRStack_20);
              pRVar1 = replacement_local;
              if (bVar2) {
                capnp::schema::Type::Reader::getStruct(&local_118,pRStack_20);
                uVar5 = capnp::schema::Type::Struct::Reader::getTypeId(&local_118);
                kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_150);
                kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_190);
                checkUpgradeToStruct(this,pRVar1,uVar5,&local_150,&local_190);
                kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_190);
                kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_150);
                return;
              }
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                      (&local_1a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x3cc,FAILED,(char *)0x0,"\"a type was changed\"",
                       (char (*) [19])"a type was changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault(&local_1a0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }